

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Draw.cpp
# Opt level: O0

void OpenSteer::drawCameraLookAt(Vec3 *cameraPosition,Vec3 *pointToLookAt,Vec3 *up_)

{
  GLfloat *in_RDI;
  Vec3 VVar1;
  Vec3 VVar2;
  Vec3 up;
  Vec3 side;
  Vec3 forward;
  float matrix2 [16];
  Vec3 *in_stack_fffffffffffffee8;
  Vec3 *this;
  undefined4 in_stack_fffffffffffffef0;
  float in_stack_fffffffffffffef4;
  Vec3 *in_stack_ffffffffffffff00;
  float local_f8;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  float fVar3;
  undefined4 in_stack_ffffffffffffff18;
  float fVar4;
  undefined4 in_stack_ffffffffffffff1c;
  Vec3 *in_stack_ffffffffffffff20;
  float local_d8;
  Vec3 *local_d0;
  float local_c8;
  Vec3 local_c4;
  Vec3 local_b8;
  undefined8 local_a8;
  float local_a0;
  Vec3 local_98;
  Vec3 local_88;
  Vec3 local_78;
  Vec3 local_68;
  float local_58 [2];
  float local_50;
  undefined4 local_4c;
  float local_48;
  float local_40;
  undefined4 local_3c;
  float local_38;
  float local_30;
  undefined4 local_2c;
  undefined4 local_28;
  undefined4 local_24;
  undefined4 local_20;
  undefined4 local_1c;
  GLfloat *local_8;
  
  local_8 = in_RDI;
  anon_unknown.dwarf_1485b::drawCameraLookAtCheck
            (in_stack_ffffffffffffff20,
             (Vec3 *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
             (Vec3 *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  (*glad_glLoadIdentity)();
  VVar1 = Vec3::operator-((Vec3 *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                          in_stack_fffffffffffffee8);
  local_78.z = VVar1.z;
  local_68.z = local_78.z;
  local_78._0_8_ = VVar1._0_8_;
  local_68.x = local_78.x;
  local_68.y = local_78.y;
  local_78 = VVar1;
  VVar1 = Vec3::normalize(in_stack_ffffffffffffff00);
  local_98.z = VVar1.z;
  local_88.z = local_98.z;
  local_98._0_8_ = VVar1._0_8_;
  local_88.x = local_98.x;
  local_88.y = local_98.y;
  local_98 = VVar1;
  VVar1 = Vec3::operator=(&local_68,&local_88);
  local_b8.z = VVar1.z;
  local_a0 = local_b8.z;
  local_b8._0_8_ = VVar1._0_8_;
  local_a8._0_4_ = local_b8.x;
  local_a8._4_4_ = local_b8.y;
  this = &local_c4;
  local_b8 = VVar1;
  Vec3::Vec3(this);
  Vec3::cross(in_stack_ffffffffffffff20,
              (Vec3 *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
              (Vec3 *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  VVar1 = Vec3::normalize(in_stack_ffffffffffffff00);
  local_d8 = VVar1.z;
  local_c8 = local_d8;
  local_d0 = VVar1._0_8_;
  VVar2 = Vec3::operator=(this,(Vec3 *)&local_d0);
  fVar3 = VVar2.x;
  fVar4 = VVar2.y;
  local_f8 = VVar2.z;
  Vec3::Vec3((Vec3 *)&stack0xfffffffffffffef4);
  Vec3::cross(VVar1._0_8_,(Vec3 *)CONCAT44(local_f8,fVar4),
              (Vec3 *)CONCAT44(fVar3,in_stack_ffffffffffffff10));
  local_58[0] = local_c4.x;
  local_48 = local_c4.y;
  local_38 = local_c4.z;
  local_28 = 0;
  local_24 = 0;
  local_50 = -local_68.x;
  local_40 = -local_68.y;
  local_30 = -local_68.z;
  local_20 = 0;
  local_2c = 0;
  local_3c = 0;
  local_4c = 0;
  local_1c = 0x3f800000;
  (*glad_glLoadMatrixf)(local_58);
  (*glad_glTranslatef)(-*local_8,-local_8[1],-local_8[2]);
  return;
}

Assistant:

void 
OpenSteer::drawCameraLookAt (const Vec3& cameraPosition,
                             const Vec3& pointToLookAt,
                             const Vec3& up_)
{
    // check for valid "look at" parameters
    drawCameraLookAtCheck (cameraPosition, pointToLookAt, up_);

    glLoadIdentity();
    float matrix2[16];

    Vec3 forward = pointToLookAt - cameraPosition;
    forward = forward.normalize();
    Vec3 side;
    side.cross(forward, up_);
    side = side.normalize();
    Vec3 up;
    up.cross(side, forward);

    matrix2[0] = side.x;
    matrix2[4] = side.y;
    matrix2[8] = side.z;
    matrix2[12] = 0.f;
    matrix2[1] = up.x;
    matrix2[5] = up.y;
    matrix2[9] = up.z;
    matrix2[13] = 0.f;
    matrix2[2] = -forward.x;
    matrix2[6] = -forward.y;
    matrix2[10] = -forward.z;
    matrix2[14] = 0.f;
    matrix2[3] = matrix2[7] = matrix2[11] = 0.f;
    matrix2[15] = 1.f;

    glLoadMatrixf(matrix2);
    glTranslatef(-cameraPosition.x, -cameraPosition.y, -cameraPosition.z);
}